

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall vm_rcdesc::get_return_addr(vm_rcdesc *this)

{
  uchar uVar1;
  uchar *puVar2;
  size_t sVar3;
  
  puVar2 = this->caller_addr;
  if (puVar2 != (uchar *)0x0) {
    uVar1 = *puVar2;
    sVar3 = CVmOpcodes::get_op_size(puVar2 + (uVar1 == 'v'));
    return puVar2 + (uVar1 == 'v') + sVar3;
  }
  return (uchar *)0x0;
}

Assistant:

const uchar *vm_rcdesc::get_return_addr() const
{
    /* if there's no caller address, there's no return address */
    if (caller_addr == 0)
        return 0;

    /* 
     *   caller_addr is a pointer to the instruction that triggered the call
     *   to the native code that in turn made the recursive call represented
     *   by 'this'.  The return address is the next instruction, so we just
     *   need to calculate the size of the instruction at caller_addr and add
     *   it to the caller address.  Start with one byte for the opcode.
     */
    const uchar *p = caller_addr;

    /* check for VARARGC, which can prefix many call instructions */
    if (*p == OPC_VARARGC)
        ++p;

    /* advance past the actual call instruction */
    p += CVmOpcodes::get_op_size(p);

    /* return the final address */
    return p;
}